

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetector.cpp
# Opt level: O0

void __thiscall MemoryLeakDetector::invalidateMemory(MemoryLeakDetector *this,char *memory)

{
  MemoryLeakDetectorNode *pMVar1;
  MemoryLeakDetectorTable *in_RSI;
  MemoryLeakDetectorNode *node;
  char *in_stack_ffffffffffffffe8;
  
  pMVar1 = MemoryLeakDetectorTable::retrieveNode(in_RSI,in_stack_ffffffffffffffe8);
  if (pMVar1 != (MemoryLeakDetectorNode *)0x0) {
    (*PlatformSpecificMemset)(in_RSI,0xcd,*(size_t *)pMVar1);
  }
  return;
}

Assistant:

void MemoryLeakDetector::invalidateMemory(char* memory)
{
#ifndef CPPUTEST_DISABLE_HEAP_POISON
  MemoryLeakDetectorNode* node = memoryTable_.retrieveNode(memory);
  if (node)
    PlatformSpecificMemset(memory, 0xCD, node->size_);
#endif
}